

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_EstimateFee_LargeAmount_MinBits36_Test::TestBody
          (ElementsTransactionApi_EstimateFee_LargeAmount_MinBits36_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  initializer_list<cfd::api::ElementsUtxoAndOption> __l_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  Amount *expected_predicate_value;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  Amount tx_fee;
  Amount utxo_fee;
  Amount calc_fee;
  uint64_t effective_fee_rate2;
  double effective_fee_rate;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  ElementsUtxoAndOption eutxo3;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  Amount fee;
  ElementsConfidentialAddress asset_address;
  ElementsConfidentialAddress address;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffa8dc;
  undefined4 in_stack_ffffffffffffa8e0;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffa8e4;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffa8ec;
  ElementsUtxoAndOption *in_stack_ffffffffffffa8f0;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *this_00;
  ElementsUtxoAndOption *in_stack_ffffffffffffa8f8;
  undefined7 in_stack_ffffffffffffa900;
  undefined1 in_stack_ffffffffffffa907;
  allocator_type *in_stack_ffffffffffffa908;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffa910;
  iterator in_stack_ffffffffffffa918;
  size_type in_stack_ffffffffffffa920;
  undefined1 ***local_5578;
  UtxoData *local_5528;
  AssertHelper local_5468;
  Message local_5460;
  undefined8 local_5458;
  AssertionResult local_5450;
  AssertHelper local_5440;
  Message local_5438;
  undefined4 local_542c;
  AssertionResult local_5428;
  uint local_5414;
  AssertHelper local_5410;
  Message local_5408;
  undefined4 local_5400;
  undefined4 local_53fc;
  AssertionResult local_53f8;
  AssertHelper local_53e8;
  Message local_53e0;
  undefined4 local_53d4;
  undefined8 local_53d0;
  AssertionResult local_53c8;
  AssertHelper local_53b8;
  Message local_53b0 [4];
  AssertHelper local_5390;
  Message local_5388;
  OutPoint local_5380;
  AssertHelper local_5358;
  Message local_5350;
  SigHashType local_5348 [15];
  allocator local_5339;
  string local_5338 [32];
  string local_5318 [39];
  allocator local_52f1;
  string local_52f0 [32];
  Pubkey local_52d0;
  OutPoint local_52b8;
  AssertHelper local_5290;
  Message local_5288 [5];
  byte local_5259;
  ConstCharPtr local_5258;
  AssertHelper local_5250;
  Message local_5248;
  OutPoint local_5240;
  AssertHelper local_5218;
  Message local_5210;
  SigHashType local_5208 [15];
  allocator local_51f9;
  string local_51f8 [32];
  string local_51d8 [39];
  allocator local_51b1;
  string local_51b0 [32];
  Pubkey local_5190;
  OutPoint local_5178;
  AssertHelper local_5150;
  Message local_5148 [5];
  byte local_5119;
  ConstCharPtr local_5118;
  AssertHelper local_5110;
  Message local_5108;
  OutPoint local_5100;
  AssertHelper local_50d8;
  Message local_50d0;
  SigHashType local_50c8 [15];
  allocator local_50b9;
  string local_50b8 [32];
  string local_5098 [39];
  allocator local_5071;
  string local_5070 [32];
  Pubkey local_5050;
  OutPoint local_5038;
  ByteData local_5010;
  string local_4ff8;
  AssertHelper local_4fd8;
  Message local_4fd0 [6];
  byte local_4f99;
  AssertionResult local_4f98;
  string local_4f88;
  AssertHelper local_4f68;
  Message local_4f60 [6];
  byte local_4f29;
  AssertionResult local_4f28;
  string local_4f18;
  AssertHelper local_4ef8;
  Message local_4ef0 [6];
  byte local_4eb9;
  AssertionResult local_4eb8;
  AssertHelper local_4ea8;
  Message local_4ea0;
  undefined4 local_4e94;
  size_type local_4e90;
  AssertionResult local_4e88;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_4e78 [24];
  AssertHelper local_4e60;
  Message local_4e58;
  undefined1 local_4e50 [24];
  AssertHelper local_4e38;
  Message local_4e30;
  undefined4 local_4e24;
  undefined8 local_4e20;
  AssertionResult local_4e18;
  AssertHelper local_4e08;
  Message local_4e00;
  undefined4 local_4df4;
  undefined8 local_4df0;
  AssertionResult local_4de8;
  AssertHelper local_4dd8;
  Message local_4dd0;
  undefined4 local_4dc4;
  undefined8 local_4dc0;
  AssertionResult local_4db8;
  undefined8 local_4da8;
  undefined1 local_4da0;
  vector local_4d98 [32];
  undefined8 local_4d78;
  undefined1 local_4d70;
  ElementsTransactionApi local_4d61;
  Amount local_4d60 [16];
  Amount local_4d50 [16];
  undefined8 local_4d40;
  undefined1 local_4d38;
  undefined8 local_4d30;
  double local_4d28;
  undefined8 **local_4d18;
  undefined1 **local_4d10 [167];
  undefined1 local_47d8 [1336];
  undefined1 local_42a0 [1336];
  undefined8 **local_3d68;
  undefined8 local_3d60;
  undefined1 local_3d58 [1360];
  UtxoData local_3808 [1336];
  UtxoData local_32d0 [1336];
  AssertHelper local_2d98;
  Message local_2d90 [2];
  UtxoData *local_2d80;
  UtxoData local_2d78 [1264];
  UtxoData local_2888 [1264];
  UtxoData local_2398 [1264];
  UtxoData *local_1ea8;
  undefined8 local_1ea0;
  Amount local_1e80 [376];
  _func_int **local_1d08;
  undefined1 local_1d00;
  undefined8 local_1cf8;
  undefined1 local_1cf0;
  undefined8 local_1ce8;
  undefined1 local_1ce0;
  undefined1 local_1cd8 [56];
  OutPoint local_1ca0;
  AssertHelper local_1c78;
  Message local_1c70 [2];
  OutPoint local_1c60 [4];
  undefined1 local_1ba8 [24];
  string local_1b90 [32];
  ElementsConfidentialAddress local_1b70 [439];
  allocator local_19b9;
  string local_19b8 [32];
  ElementsConfidentialAddress local_1998 [439];
  allocator local_17e1;
  string local_17e0 [32];
  ConfidentialAssetId local_17c0;
  undefined8 local_1798;
  undefined1 local_1790;
  allocator local_1781;
  string local_1780 [32];
  string local_1760 [383];
  allocator local_15e1;
  string local_15e0 [32];
  Script local_15c0;
  allocator local_1581;
  string local_1580 [32];
  Txid local_1560;
  undefined8 local_1540 [5];
  Txid local_1518;
  uint local_14f8;
  Script local_14f0 [2];
  Address local_1480 [376];
  string local_1308 [32];
  undefined8 local_12e8;
  undefined1 local_12e0;
  undefined4 local_12d8;
  undefined8 local_12d0;
  ConfidentialAssetId local_12c8 [15];
  allocator local_1049;
  string local_1048 [32];
  ConfidentialValue local_1028;
  allocator local_ff9;
  string local_ff8 [32];
  BlindFactor local_fd8;
  allocator local_fb1;
  string local_fb0 [32];
  BlindFactor local_f90;
  allocator local_f69;
  string local_f68 [32];
  ConfidentialAssetId local_f48;
  _func_int **local_f20;
  undefined1 local_f18;
  allocator local_f09;
  string local_f08 [32];
  string local_ee8 [383];
  allocator local_d69;
  string local_d68 [32];
  Script local_d48;
  allocator local_d09;
  string local_d08 [32];
  Txid local_ce8;
  undefined8 local_cc8 [5];
  Txid local_ca0;
  uint local_c80;
  Script local_c78 [2];
  Address local_c08 [376];
  string local_a90 [32];
  undefined1 local_a70 [504];
  BlindFactor local_878;
  BlindFactor local_858;
  ConfidentialValue local_838 [2];
  allocator local_7d1;
  string local_7d0 [32];
  ConfidentialAssetId local_7b0;
  undefined8 local_788;
  undefined1 local_780;
  allocator local_771;
  string local_770 [32];
  string local_750 [383];
  allocator local_5d1;
  string local_5d0 [32];
  Script local_5b0;
  allocator local_571;
  string local_570 [32];
  Txid local_550;
  undefined8 local_520 [5];
  Txid local_4f8;
  uint local_4d8;
  Script local_4d0 [2];
  Address local_460 [376];
  string local_2e8 [32];
  undefined8 local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  ConfidentialAssetId local_2a8 [15];
  ElementsAddressFactory local_30 [48];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(local_30,kElementsRegtest);
  cfd::UtxoData::UtxoData((UtxoData *)local_520);
  local_520[0] = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_571
            );
  cfd::core::Txid::Txid(&local_550,local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x282d46);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5d0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_5d1);
  cfd::core::Script::Script(&local_5b0,local_5d0);
  cfd::core::Script::operator=(local_4d0,&local_5b0);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_771);
  cfd::AddressFactory::GetAddress(local_750);
  cfd::core::Address::operator=(local_460,(Address *)local_750);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::operator=
            (local_2e8,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount((Amount *)&local_788,100000000000000);
  local_2c0 = local_780;
  local_2c8 = local_788;
  local_2b8 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7d0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_7d1
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7b0,local_7d0);
  cfd::core::ConfidentialAssetId::operator=(local_2a8,&local_7b0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x282f49);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  cfd::UtxoData::UtxoData((UtxoData *)local_cc8);
  local_cc8[0] = 0;
  local_a70._24_8_ = (pointer)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d08,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",&local_d09
            );
  cfd::core::Txid::Txid(&local_ce8,local_d08);
  cfd::core::Txid::operator=(&local_ca0,&local_ce8);
  cfd::core::Txid::~Txid((Txid *)0x282ff8);
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  local_c80 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d68,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d69);
  cfd::core::Script::Script(&local_d48,local_d68);
  cfd::core::Script::operator=(local_c78,&local_d48);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",&local_f09);
  cfd::AddressFactory::GetAddress(local_ee8);
  cfd::core::Address::operator=(local_c08,(Address *)local_ee8);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  std::__cxx11::string::operator=
            (local_a90,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount((Amount *)&local_f20,18000000000000);
  local_a70[8] = local_f18;
  local_a70._0_8_ = local_f20;
  local_a70._16_4_ = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f68,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",&local_f69
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_f48,local_f68);
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(local_a70 + 0x20),&local_f48);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2831fb);
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fb0,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e",&local_fb1
            );
  cfd::core::BlindFactor::BlindFactor(&local_f90,local_fb0);
  cfd::core::BlindFactor::operator=(&local_878,&local_f90);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x283283);
  std::__cxx11::string::~string(local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ff8,"6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc",&local_ff9
            );
  cfd::core::BlindFactor::BlindFactor(&local_fd8,local_ff8);
  cfd::core::BlindFactor::operator=(&local_858,&local_fd8);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x28330b);
  std::__cxx11::string::~string(local_ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1048,"09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa",
             &local_1049);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1028,local_1048);
  cfd::core::ConfidentialValue::operator=(local_838,&local_1028);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x283393);
  std::__cxx11::string::~string(local_1048);
  std::allocator<char>::~allocator((allocator<char> *)&local_1049);
  cfd::UtxoData::UtxoData((UtxoData *)local_1540);
  local_1540[0] = 0;
  local_12d0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1580,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             &local_1581);
  cfd::core::Txid::Txid(&local_1560,local_1580);
  cfd::core::Txid::operator=(&local_1518,&local_1560);
  cfd::core::Txid::~Txid((Txid *)0x283442);
  std::__cxx11::string::~string(local_1580);
  std::allocator<char>::~allocator((allocator<char> *)&local_1581);
  local_14f8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_15e0,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_15e1);
  cfd::core::Script::Script(&local_15c0,local_15e0);
  cfd::core::Script::operator=(local_14f0,&local_15c0);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  std::__cxx11::string::~string(local_15e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1780,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_1781)
  ;
  cfd::AddressFactory::GetAddress(local_1760);
  cfd::core::Address::operator=(local_1480,(Address *)local_1760);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  std::__cxx11::string::~string(local_1780);
  std::allocator<char>::~allocator((allocator<char> *)&local_1781);
  std::__cxx11::string::operator=
            (local_1308,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount((Amount *)&local_1798,100000000000000);
  local_12e0 = local_1790;
  local_12e8 = local_1798;
  local_12d8 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_17e0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             &local_17e1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_17c0,local_17e0);
  cfd::core::ConfidentialAssetId::operator=(local_12c8,&local_17c0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x283645);
  std::__cxx11::string::~string(local_17e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_19b8,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz",
             &local_19b9);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1998,local_19b8);
  std::__cxx11::string::~string(local_19b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b90,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS",
             (allocator *)(local_1ba8 + 0x17));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1b70,local_1b90);
  std::__cxx11::string::~string(local_1b90);
  std::allocator<char>::~allocator((allocator<char> *)(local_1ba8 + 0x17));
  cfd::core::Amount::Amount((Amount *)local_1ba8,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1c60,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::AddInput((UtxoData *)local_1c60);
    }
  }
  else {
    testing::Message::Message(local_1c70);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x160,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1c78,local_1c70);
    testing::internal::AssertHelper::~AssertHelper(&local_1c78);
    testing::Message::~Message((Message *)0x283fca);
  }
  cfd::core::OutPoint::OutPoint(&local_1ca0,&local_ca0,local_c80);
  cfd::ConfidentialTransactionContext::AddTxIn(local_1c60);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x284057);
  cfd::core::OutPoint::OutPoint((OutPoint *)(local_1cd8 + 0x10),&local_1518,local_14f8);
  cfd::ConfidentialTransactionContext::AddTxIn(local_1c60);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x284099);
  local_1cf8 = cfd::core::operator+((Amount *)&local_2c8,(Amount *)&local_12e8);
  local_1cf0 = extraout_DL;
  local_1ce8 = local_1cf8;
  local_1ce0 = extraout_DL;
  local_1d08 = (_func_int **)cfd::core::operator-((Amount *)&local_1ce8,(Amount *)local_1ba8);
  local_1d00 = extraout_DL_00;
  local_1cd8._0_8_ = local_1d08;
  local_1cd8[8] = extraout_DL_00;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)local_1c60,(Amount *)local_1998,
             (ConfidentialAssetId *)local_1cd8,SUB81(local_2a8,0));
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_1c60,local_1e80,(ConfidentialAssetId *)local_a70);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((Amount *)local_1c60,(ConfidentialAssetId *)local_1ba8);
  local_2d80 = local_2d78;
  cfd::UtxoData::UtxoData(local_2d80,(UtxoData *)local_520);
  local_2d80 = local_2888;
  cfd::UtxoData::UtxoData(local_2d80,(UtxoData *)local_cc8);
  local_2d80 = local_2398;
  cfd::UtxoData::UtxoData(local_2d80,(UtxoData *)local_1540);
  local_1ea8 = local_2d78;
  local_1ea0 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x28427f);
  __l._M_len = in_stack_ffffffffffffa920;
  __l._M_array = &in_stack_ffffffffffffa918->utxo;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffa910,__l,(allocator_type *)in_stack_ffffffffffffa908);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2842b3);
  local_5528 = (UtxoData *)&local_1ea8;
  do {
    local_5528 = local_5528 + -0x4f0;
    cfd::UtxoData::~UtxoData
              ((UtxoData *)CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  } while (local_5528 != local_2d78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)local_1c60);
    }
  }
  else {
    testing::Message::Message(local_2d90);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x168,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2d98,local_2d90);
    testing::internal::AssertHelper::~AssertHelper(&local_2d98);
    testing::Message::~Message((Message *)0x28457e);
  }
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa8f0);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa8f0);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa8f0);
  cfd::UtxoData::operator=(local_32d0,(UtxoData *)local_520);
  cfd::UtxoData::operator=(local_3808,(UtxoData *)local_cc8);
  cfd::UtxoData::operator=((UtxoData *)(local_3d58 + 0x18),(UtxoData *)local_1540);
  local_4d18 = local_4d10;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT17(in_stack_ffffffffffffa907,in_stack_ffffffffffffa900),
             in_stack_ffffffffffffa8f8);
  local_4d18 = (undefined8 **)local_47d8;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT17(in_stack_ffffffffffffa907,in_stack_ffffffffffffa900),
             in_stack_ffffffffffffa8f8);
  local_4d18 = (undefined8 **)local_42a0;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT17(in_stack_ffffffffffffa907,in_stack_ffffffffffffa900),
             in_stack_ffffffffffffa8f8);
  local_3d68 = local_4d10;
  local_3d60 = 3;
  std::allocator<cfd::api::ElementsUtxoAndOption>::allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2846c9);
  __l_00._M_len = in_stack_ffffffffffffa920;
  __l_00._M_array = in_stack_ffffffffffffa918;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)in_stack_ffffffffffffa910,__l_00,in_stack_ffffffffffffa908);
  std::allocator<cfd::api::ElementsUtxoAndOption>::~allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2846fd);
  local_5578 = (undefined1 ***)&local_3d68;
  do {
    local_5578 = local_5578 + -0xa7;
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
              ((ElementsUtxoAndOption *)
               CONCAT44(in_stack_ffffffffffffa8e4,in_stack_ffffffffffffa8e0));
  } while (local_5578 != local_4d10);
  local_4d28 = 0.1;
  local_4d30 = 100;
  cfd::core::Amount::Amount((Amount *)&local_4d40);
  cfd::core::Amount::Amount(local_4d50);
  cfd::core::Amount::Amount(local_4d60);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_4d61);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  this_00 = (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)0x0;
  uVar10 = 0x24;
  uVar9 = 0;
  uVar8 = 1;
  expected_predicate_value = local_4d50;
  local_4da8 = cfd::api::ElementsTransactionApi::EstimateFee
                         ((string *)&local_4d61,local_4d98,(ConfidentialAssetId *)local_3d58,
                          (Amount *)local_2a8,local_4d60,SUB81(expected_predicate_value,0),
                          local_4d28,1,0,(uint *)CONCAT44(in_stack_ffffffffffffa8ec,0x24));
  local_4da0 = extraout_DL_01;
  local_4d78 = local_4da8;
  local_4d70 = extraout_DL_01;
  local_4d40 = local_4da8;
  local_4d38 = extraout_DL_01;
  std::__cxx11::string::~string((string *)local_4d98);
  local_4dc0 = cfd::core::Amount::GetSatoshiValue();
  local_4dc4 = 0x100;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa8f8,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10),
             (int *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4db8);
  if (!bVar1) {
    testing::Message::Message(&local_4dd0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x284acf);
    testing::internal::AssertHelper::AssertHelper
              (&local_4dd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4dd8,&local_4dd0);
    testing::internal::AssertHelper::~AssertHelper(&local_4dd8);
    testing::Message::~Message((Message *)0x284b32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x284b8a);
  local_4df0 = cfd::core::Amount::GetSatoshiValue();
  local_4df4 = 0xe1;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa8f8,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10),
             (int *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4de8);
  if (!bVar1) {
    testing::Message::Message(&local_4e00);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x284c58);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4e08,&local_4e00);
    testing::internal::AssertHelper::~AssertHelper(&local_4e08);
    testing::Message::~Message((Message *)0x284cbb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x284d13);
  local_4e20 = cfd::core::Amount::GetSatoshiValue();
  local_4e24 = 0x20;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa8f8,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10),
             (int *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e18);
  if (!bVar1) {
    testing::Message::Message(&local_4e30);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x284de1);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4e38,&local_4e30);
    testing::internal::AssertHelper::~AssertHelper(&local_4e38);
    testing::Message::~Message((Message *)0x284e44);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x284e9c);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x284eb1);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_00,(value_type *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      expected_predicate_value = (Amount *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                ((vector *)local_1c60,(long)local_4e50,1,0,(vector *)0x24);
    }
  }
  else {
    testing::Message::Message(&local_4e58);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x183,
               "Expected: txc.Blind(&ct_addrs, 1, 0, 36) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_4e60,&local_4e58);
    testing::internal::AssertHelper::~AssertHelper(&local_4e60);
    testing::Message::~Message((Message *)0x284ffd);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList();
  local_4e90 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::size(local_4e78);
  local_4e94 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)in_stack_ffffffffffffa8f8,(char *)this_00,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10),
             (int *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e88);
  if (!bVar1) {
    testing::Message::Message(&local_4ea0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x285122);
    testing::internal::AssertHelper::AssertHelper
              (&local_4ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x185,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4ea8,&local_4ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_4ea8);
    testing::Message::~Message((Message *)0x285185);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2851dd);
  sVar5 = std::
          vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
          ::size(local_4e78);
  if (sVar5 == 3) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_4e78,0);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue
              ((ConfidentialTxOutReference *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8));
    local_4eb9 = cfd::core::ConfidentialValue::HasBlinding();
    local_4eb9 = local_4eb9 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9),
               (bool *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8),(type *)0x285256);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x285265);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4eb8);
    if (!bVar1) {
      testing::Message::Message(local_4ef0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4f18,(internal *)&local_4eb8,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4ef8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x187,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4ef8,local_4ef0);
      testing::internal::AssertHelper::~AssertHelper(&local_4ef8);
      std::__cxx11::string::~string((string *)&local_4f18);
      testing::Message::~Message((Message *)0x285387);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x285402);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_4e78,1);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue
              ((ConfidentialTxOutReference *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8));
    local_4f29 = cfd::core::ConfidentialValue::HasBlinding();
    local_4f29 = local_4f29 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9),
               (bool *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8),(type *)0x285465);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x285474);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f28);
    if (!bVar1) {
      testing::Message::Message(local_4f60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4f88,(internal *)&local_4f28,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4f68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x188,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4f68,local_4f60);
      testing::internal::AssertHelper::~AssertHelper(&local_4f68);
      std::__cxx11::string::~string((string *)&local_4f88);
      testing::Message::~Message((Message *)0x285596);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x285611);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_4e78,2);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue
              ((ConfidentialTxOutReference *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8));
    bVar2 = cfd::core::ConfidentialValue::HasBlinding();
    local_4f99 = ~bVar2 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9),
               (bool *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8),(type *)0x285676);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x285685);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f98);
    if (!bVar1) {
      testing::Message::Message(local_4fd0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4ff8,(internal *)&local_4f98,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 (char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4fd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x189,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4fd8,local_4fd0);
      testing::internal::AssertHelper::~AssertHelper(&local_4fd8);
      std::__cxx11::string::~string((string *)&local_4ff8);
      testing::Message::~Message((Message *)0x2857a7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x28581f);
  }
  cfd::core::ByteData::ByteData(&local_5010);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5038,&local_4f8,local_4d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5070,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 &local_5071);
      cfd::core::Pubkey::Pubkey(&local_5050,local_5070);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_50b8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_50b9);
      cfd::core::Privkey::FromWif(local_5098,(NetType)local_50b8,true);
      cfd::core::SigHashType::SigHashType(local_50c8);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_1c60,&local_5038,&local_5050,local_5098,local_50c8,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x285988);
      std::__cxx11::string::~string(local_50b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_50b9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2859af);
      std::__cxx11::string::~string(local_5070);
      std::allocator<char>::~allocator((allocator<char> *)&local_5071);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2859d6);
    }
  }
  else {
    testing::Message::Message(&local_50d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_50d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x191,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50d8,&local_50d0);
    testing::internal::AssertHelper::~AssertHelper(&local_50d8);
    testing::Message::~Message((Message *)0x285b68);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5100,&local_4f8,local_4d8);
      cfd::ConfidentialTransactionContext::Verify(local_1c60);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x285c31);
    }
  }
  else {
    testing::Message::Message(&local_5108);
    testing::internal::AssertHelper::AssertHelper
              (&local_5110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x192,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5110,&local_5108);
    testing::internal::AssertHelper::~AssertHelper(&local_5110);
    testing::Message::~Message((Message *)0x285cfb);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_5118,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_5118);
  if (bVar1) {
    local_5119 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9),
                 (ByteData *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8));
      cfd::core::ByteData::~ByteData((ByteData *)0x285de1);
    }
    if ((local_5119 & 1) == 0) {
      local_5118.value =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_00285e84;
    }
  }
  else {
LAB_00285e84:
    testing::Message::Message(local_5148);
    testing::internal::AssertHelper::AssertHelper
              (&local_5150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x194,local_5118.value);
    testing::internal::AssertHelper::operator=(&local_5150,local_5148);
    testing::internal::AssertHelper::~AssertHelper(&local_5150);
    testing::Message::~Message((Message *)0x285eec);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5178,&local_ca0,local_c80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_51b0,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",
                 &local_51b1);
      cfd::core::Pubkey::Pubkey(&local_5190,local_51b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_51f8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",&local_51f9);
      cfd::core::Privkey::FromWif(local_51d8,(NetType)local_51f8,true);
      cfd::core::SigHashType::SigHashType(local_5208);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_1c60,&local_5178,&local_5190,local_51d8,local_5208,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x28607d);
      std::__cxx11::string::~string(local_51f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_51f9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2860a4);
      std::__cxx11::string::~string(local_51b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_51b1);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2860cb);
    }
  }
  else {
    testing::Message::Message(&local_5210);
    testing::internal::AssertHelper::AssertHelper
              (&local_5218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x199,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5218,&local_5210);
    testing::internal::AssertHelper::~AssertHelper(&local_5218);
    testing::Message::~Message((Message *)0x286244);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5240,&local_ca0,local_c80);
      cfd::ConfidentialTransactionContext::Verify(local_1c60);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x28630d);
    }
  }
  else {
    testing::Message::Message(&local_5248);
    testing::internal::AssertHelper::AssertHelper
              (&local_5250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x19a,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5250,&local_5248);
    testing::internal::AssertHelper::~AssertHelper(&local_5250);
    testing::Message::~Message((Message *)0x2863d7);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_5258,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_5258);
  if (bVar1) {
    local_5259 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9),
                 (ByteData *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8));
      cfd::core::ByteData::~ByteData((ByteData *)0x2864bd);
    }
    if ((local_5259 & 1) != 0) goto LAB_00286613;
    local_5258.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_5288);
  testing::internal::AssertHelper::AssertHelper
            (&local_5290,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x19c,local_5258.value);
  testing::internal::AssertHelper::operator=(&local_5290,local_5288);
  testing::internal::AssertHelper::~AssertHelper(&local_5290);
  testing::Message::~Message((Message *)0x2865c8);
LAB_00286613:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_52b8,&local_1518,local_14f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_52f0,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 &local_52f1);
      cfd::core::Pubkey::Pubkey(&local_52d0,local_52f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5338,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_5339);
      cfd::core::Privkey::FromWif(local_5318,(NetType)local_5338,true);
      cfd::core::SigHashType::SigHashType(local_5348);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_1c60,&local_52b8,&local_52d0,local_5318,local_5348,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x286759);
      std::__cxx11::string::~string(local_5338);
      std::allocator<char>::~allocator((allocator<char> *)&local_5339);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x286780);
      std::__cxx11::string::~string(local_52f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_52f1);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2867a7);
    }
  }
  else {
    testing::Message::Message(&local_5350);
    testing::internal::AssertHelper::AssertHelper
              (&local_5358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a1,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5358,&local_5350);
    testing::internal::AssertHelper::~AssertHelper(&local_5358);
    testing::Message::~Message((Message *)0x286920);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5380,&local_1518,local_14f8);
      cfd::ConfidentialTransactionContext::Verify(local_1c60);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2869e9);
    }
  }
  else {
    testing::Message::Message(&local_5388);
    testing::internal::AssertHelper::AssertHelper
              (&local_5390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a2,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5390,&local_5388);
    testing::internal::AssertHelper::~AssertHelper(&local_5390);
    testing::Message::~Message((Message *)0x286ab3);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9),
                 (ByteData *)CONCAT44(in_stack_ffffffffffffa8dc,uVar8));
      cfd::core::ByteData::~ByteData((ByteData *)0x286b70);
    }
  }
  else {
    testing::Message::Message(local_53b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_53b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a4,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_53b8,local_53b0);
    testing::internal::AssertHelper::~AssertHelper(&local_53b8);
    testing::Message::~Message((Message *)0x286c17);
  }
  lVar6 = cfd::core::ByteData::GetDataSize();
  if ((((lVar6 != 0x2155) && (lVar6 = cfd::core::ByteData::GetDataSize(), lVar6 != 0x2156)) &&
      (lVar6 = cfd::core::ByteData::GetDataSize(), lVar6 != 0x2157)) &&
     (lVar6 = cfd::core::ByteData::GetDataSize(), lVar6 != 0x2158)) {
    local_53d0 = cfd::core::ByteData::GetDataSize();
    local_53d4 = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((char *)in_stack_ffffffffffffa8f8,(char *)this_00,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10),
               (int *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_53c8);
    if (!bVar1) {
      testing::Message::Message(&local_53e0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x286dca);
      testing::internal::AssertHelper::AssertHelper
                (&local_53e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1a8,pcVar4);
      testing::internal::AssertHelper::operator=(&local_53e8,&local_53e0);
      testing::internal::AssertHelper::~AssertHelper(&local_53e8);
      testing::Message::~Message((Message *)0x286e2d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x286e82);
  }
  iVar3 = cfd::core::ConfidentialTransaction::GetVsize();
  if (((iVar3 != 0x9f7) && (iVar3 = cfd::core::ConfidentialTransaction::GetVsize(), iVar3 != 0x9f8))
     && (iVar3 = cfd::core::ConfidentialTransaction::GetVsize(), iVar3 != 0x9f9)) {
    local_53fc = cfd::core::ConfidentialTransaction::GetVsize();
    local_5400 = 0x9f8;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)in_stack_ffffffffffffa8f8,(char *)this_00,
               (uint *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10),
               (int *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_53f8);
    if (!bVar1) {
      testing::Message::Message(&local_5408);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x286fa9);
      testing::internal::AssertHelper::AssertHelper
                (&local_5410,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1ac,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5410,&local_5408);
      testing::internal::AssertHelper::~AssertHelper(&local_5410);
      testing::Message::~Message((Message *)0x287006);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x28705b);
  }
  iVar3 = cfd::core::ConfidentialTransaction::GetVsize();
  local_5414 = (uint)(iVar3 * (int)local_4d30) / 1000;
  local_542c = 0xff;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)in_stack_ffffffffffffa8f8,(char *)this_00,
             (uint *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10),
             (int *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5428);
  if (!bVar1) {
    testing::Message::Message(&local_5438);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x287131);
    testing::internal::AssertHelper::AssertHelper
              (&local_5440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1b0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5440,&local_5438);
    testing::internal::AssertHelper::~AssertHelper(&local_5440);
    testing::Message::~Message((Message *)0x28718e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2871e6);
  uVar7 = cfd::core::Amount::GetSatoshiValue();
  if (((uVar7 != local_5414) &&
      (uVar7 = cfd::core::Amount::GetSatoshiValue(), uVar7 != local_5414 + 1)) &&
     (uVar7 = cfd::core::Amount::GetSatoshiValue(), uVar7 != local_5414 + 2)) {
    local_5458 = cfd::core::Amount::GetSatoshiValue();
    testing::internal::EqHelper<false>::Compare<long,unsigned_int>
              ((char *)in_stack_ffffffffffffa8f8,(char *)this_00,
               (long *)CONCAT44(in_stack_ffffffffffffa8ec,uVar10),
               (uint *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5450);
    if (!bVar1) {
      testing::Message::Message(&local_5460);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x287322);
      testing::internal::AssertHelper::AssertHelper
                (&local_5468,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1b4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5468,&local_5460);
      testing::internal::AssertHelper::~AssertHelper(&local_5468);
      testing::Message::~Message((Message *)0x28737f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2873d4);
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x2873f5);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(this_00);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_00);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_00);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_00);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa8e4,uVar9));
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2874ab);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_LargeAmount_MinBits36)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{100000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{18000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{100000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxIn(OutPoint(utxo3.txid, utxo3.vout));
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ElementsUtxoAndOption eutxo1;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo3;
  eutxo1.utxo = utxo1;
  eutxo2.utxo = utxo2;
  eutxo3.utxo = utxo3;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1, eutxo2, eutxo3
  };

  // check estimateFee
  double effective_fee_rate = 0.1;
  uint64_t effective_fee_rate2 = 100;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, true, effective_fee_rate, 0, 36);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 256);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 225);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 32);

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs, 1, 0, 36));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 8533) && (tx.GetDataSize() != 8534) &&
      (tx.GetDataSize() != 8535) && (tx.GetDataSize() != 8536)) {
    EXPECT_EQ(tx.GetDataSize(), 0);
  }

  if ((txc.GetVsize() != 2551) && (txc.GetVsize() != 2552) && (txc.GetVsize() != 2553)) {
    EXPECT_EQ(txc.GetVsize(), 2552);
  }

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate2) / 1000;
  EXPECT_EQ(minimum_fee, 255);
  if ((calc_fee.GetSatoshiValue() != minimum_fee) &&
      (calc_fee.GetSatoshiValue() != (minimum_fee + 1)) &&
      (calc_fee.GetSatoshiValue() != (minimum_fee + 2))) {
    EXPECT_EQ(calc_fee.GetSatoshiValue(), minimum_fee);
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");
}